

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdot.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  uint uVar4;
  double dVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  undefined1 auVar8 [14];
  undefined1 auVar9 [14];
  undefined1 auVar10 [14];
  undefined1 auVar11 [14];
  undefined1 auVar12 [14];
  undefined1 auVar13 [14];
  undefined1 auVar14 [14];
  undefined1 auVar15 [15];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [13];
  undefined1 auVar22 [14];
  undefined1 auVar23 [11];
  undefined1 auVar24 [14];
  undefined1 auVar25 [14];
  undefined1 auVar26 [14];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  uint6 uVar31;
  int iVar32;
  size_t __i;
  long lVar33;
  vector<float,_std::allocator<float>_> *values;
  pointer *values_00;
  undefined8 *puVar34;
  undefined8 *puVar35;
  long lVar36;
  ulong uVar37;
  pointer paVar38;
  pointer paVar39;
  vector<block_q4_0,_std::allocator<block_q4_0>_> *pvVar40;
  uint8_t *puVar41;
  pointer *ppfVar42;
  value_type *__val;
  long lVar43;
  long lVar44;
  value_type *__val_1;
  int iVar45;
  bool bVar46;
  float mean;
  float fVar47;
  float fVar48;
  double dVar49;
  undefined4 extraout_XMM0_Db;
  undefined1 auVar50 [16];
  float fVar51;
  undefined4 uVar52;
  float fVar53;
  int iVar54;
  int iVar55;
  int iVar56;
  undefined1 auVar57 [15];
  undefined1 auVar58 [16];
  ushort uVar59;
  undefined1 auVar60 [15];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  bool local_14e6;
  int local_14e4;
  block_q8_0 *y;
  double local_14d8;
  double local_14d0;
  double local_14c8;
  double local_14c0;
  double local_14b8;
  float result;
  double local_14a0;
  double local_1498;
  double local_1490;
  undefined8 local_1488;
  undefined4 uStack_147c;
  undefined8 *local_1470;
  vector<block_q4_0,_std::allocator<block_q4_0>_> q40;
  vector<block_q4_1,_std::allocator<block_q4_1>_> q41;
  double local_1408;
  double local_1400;
  mt19937 rndm;
  
  local_14e4 = 10;
  local_14e6 = true;
  if ((argc < 2) || (local_14e4 = atoi(argv[1]), argc == 2)) {
    bVar46 = true;
  }
  else {
    iVar45 = atoi(argv[2]);
    bVar46 = iVar45 == 0;
    if (3 < (uint)argc) {
      iVar32 = atoi(argv[3]);
      local_14e6 = iVar32 == 0;
      if (iVar45 != 0 && !local_14e6) {
        puts("It is not possible to use Q4_1 quantization and scalar implementations");
        return 1;
      }
    }
  }
  rndm._M_x[0] = 0x4d2;
  lVar33 = 1;
  uVar37 = 0x4d2;
  do {
    uVar37 = (ulong)(((uint)(uVar37 >> 0x1e) ^ (uint)uVar37) * 0x6c078965 + (int)lVar33);
    rndm._M_x[lVar33] = uVar37;
    lVar33 = lVar33 + 1;
  } while (lVar33 != 0x270);
  rndm._M_p = 0x270;
  values = (vector<float,_std::allocator<float>_> *)operator_new(0x100000);
  memset(values,0,0x100000);
  values_00 = (pointer *)operator_new(0x100000);
  memset(values_00,0,0x100000);
  local_1470 = (undefined8 *)ggml_get_type_traits_cpu(local_14e6 ^ 3);
  q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (local_14e6 == false) {
    std::vector<block_q4_1,_std::allocator<block_q4_1>_>::resize(&q41,0x2000);
  }
  else {
    std::vector<block_q4_0,_std::allocator<block_q4_0>_>::resize(&q40,0x2000);
  }
  puVar34 = (undefined8 *)operator_new(0x48000);
  puVar34[2] = 0;
  puVar34[3] = 0;
  *puVar34 = 0;
  puVar34[1] = 0;
  *(undefined4 *)(puVar34 + 4) = 0;
  lVar33 = 0x24;
  do {
    *(undefined4 *)((long)puVar34 + lVar33 + 0x20) = *(undefined4 *)(puVar34 + 4);
    uVar16 = *puVar34;
    uVar17 = puVar34[1];
    uVar18 = puVar34[3];
    puVar35 = (undefined8 *)((long)puVar34 + lVar33 + 0x10);
    *puVar35 = puVar34[2];
    puVar35[1] = uVar18;
    *(undefined8 *)((long)puVar34 + lVar33) = uVar16;
    ((undefined8 *)((long)puVar34 + lVar33))[1] = uVar17;
    lVar33 = lVar33 + 0x24;
  } while (lVar33 != 0x48000);
  dVar49 = 0.0;
  fVar51 = 0.0;
  local_1408 = 0.0;
  local_14c8 = 0.0;
  local_14a0 = 0.0;
  local_14c0 = 0.0;
  local_1498 = 0.0;
  local_14d8 = 0.0;
  local_14d0 = 0.0;
  local_1490 = 0.0;
  if (0 < local_14e4) {
    local_1490 = 0.0;
    iVar45 = 0;
    local_14d0 = 0.0;
    local_14d8 = 0.0;
    local_1498 = 0.0;
    local_14c0 = 0.0;
    local_14a0 = 0.0;
    local_14c8 = 0.0;
    local_1400 = 0.0;
    local_1408 = 0.0;
    do {
      fillRandomGaussianFloats
                (values,(mt19937 *)
                        &values[0xaaaa].super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage,fVar51);
      fillRandomGaussianFloats
                ((vector<float,_std::allocator<float>_> *)values_00,(mt19937 *)(values_00 + 0x20000)
                 ,mean);
      lVar33 = 0;
      do {
        local_1490 = local_1490 +
                     (double)(*(float *)((long)&(values->
                                                super__Vector_base<float,_std::allocator<float>_>).
                                                _M_impl.super__Vector_impl_data._M_start +
                                        lVar33 * 4) * *(float *)((long)values_00 + lVar33 * 4));
        lVar33 = lVar33 + 1;
      } while (lVar33 != 0x40000);
      if (local_14e6 == false) {
        (*(code *)*local_1470)
                  (values,q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                          super__Vector_impl_data._M_start,0x40000);
        lVar33 = std::chrono::_V2::system_clock::now();
        local_14b8 = 0.0;
        iVar32 = 0;
        paVar39 = q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppfVar42 = values_00;
        do {
          fVar51 = 0.0;
          lVar44 = 0;
          fVar53 = 0.0;
          do {
            uVar4 = *(uint *)(paVar39->qs + lVar44);
            fVar48 = *(float *)((long)ppfVar42 + lVar44 * 8 + 4);
            fVar47 = *(float *)((long)ppfVar42 + lVar44 * 8 + 0xc);
            fVar2 = *(float *)((long)ppfVar42 + lVar44 * 8 + 0x14);
            fVar3 = *(float *)((long)ppfVar42 + lVar44 * 8 + 0x1c);
            fVar53 = fVar53 + *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                        (ulong)(uVar4 >> 0x1c) * 4) * fVar3 +
                              *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                        (uVar4 >> 0x16 & 0x3c)) * *(float *)(ppfVar42 + lVar44 + 3)
                              + *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (uVar4 >> 0x12 & 0x3c)) * fVar2 +
                                *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                          (uVar4 >> 0xe & 0x3c)) * *(float *)(ppfVar42 + lVar44 + 2)
                                + *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                            (uVar4 >> 10 & 0x3c)) * fVar47 +
                                  *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                            (uVar4 >> 6 & 0x3c)) * *(float *)(ppfVar42 + lVar44 + 1)
                                  + *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                              (ulong)(uVar4 & 0xf) * 4) *
                                    *(float *)(ppfVar42 + lVar44) +
                                    *(float *)(dot41(int,block_q4_1_const*,float_const*)::kValues +
                                              (uVar4 >> 2 & 0x3c)) * fVar48;
            fVar51 = fVar51 + *(float *)(ppfVar42 + lVar44) + fVar48 +
                              *(float *)(ppfVar42 + lVar44 + 1) + fVar47 +
                              *(float *)(ppfVar42 + lVar44 + 2) + fVar2 +
                              *(float *)(ppfVar42 + lVar44 + 3) + fVar3;
            lVar44 = lVar44 + 4;
          } while (lVar44 != 0x10);
          ppfVar42 = ppfVar42 + 0x10;
          local_14b8 = local_14b8 + (double)(fVar53 * paVar39->d + fVar51 * paVar39->m);
          paVar39 = paVar39 + 1;
          iVar32 = iVar32 + 1;
        } while (iVar32 != 0x2000);
      }
      else {
        (*(code *)*local_1470)
                  (values,q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                          super__Vector_impl_data._M_start,0x40000);
        lVar33 = std::chrono::_V2::system_clock::now();
        local_14b8 = 0.0;
        iVar32 = 0;
        paVar38 = q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppfVar42 = values_00;
        do {
          fVar51 = 0.0;
          lVar44 = 0;
          do {
            uVar4 = *(uint *)(paVar38->qs + lVar44);
            fVar51 = fVar51 + *(float *)((long)ppfVar42 + lVar44 * 8 + 0x1c) *
                              *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                        (ulong)(uVar4 >> 0x1c) * 4) +
                              *(float *)(ppfVar42 + lVar44 + 3) *
                              *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                        (uVar4 >> 0x16 & 0x3c)) +
                              *(float *)((long)ppfVar42 + lVar44 * 8 + 0x14) *
                              *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                        (uVar4 >> 0x12 & 0x3c)) +
                              *(float *)(ppfVar42 + lVar44 + 2) *
                              *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                        (uVar4 >> 0xe & 0x3c)) +
                              *(float *)((long)ppfVar42 + lVar44 * 8 + 0xc) *
                              *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                        (uVar4 >> 10 & 0x3c)) +
                              *(float *)(ppfVar42 + lVar44 + 1) *
                              *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                        (uVar4 >> 6 & 0x3c)) +
                              *(float *)(ppfVar42 + lVar44) *
                              *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                        (ulong)(uVar4 & 0xf) * 4) +
                              *(float *)((long)ppfVar42 + lVar44 * 8 + 4) *
                              *(float *)(dot(int,block_q4_0_const*,float_const*)::kValues +
                                        (uVar4 >> 2 & 0x3c));
            lVar44 = lVar44 + 4;
          } while (lVar44 != 0x10);
          ppfVar42 = ppfVar42 + 0x10;
          local_14b8 = local_14b8 + (double)(paVar38->d * fVar51);
          paVar38 = paVar38 + 1;
          iVar32 = iVar32 + 1;
        } while (iVar32 != 0x2000);
      }
      lVar44 = std::chrono::_V2::system_clock::now();
      dVar49 = (double)(lVar44 - lVar33) * 0.001;
      lVar33 = std::chrono::_V2::system_clock::now();
      if (bVar46) {
        puVar35 = (undefined8 *)ggml_get_type_traits_cpu(*(undefined4 *)(local_1470 + 2));
        (*(code *)*puVar35)(values_00,puVar34,0x40000);
        pvVar40 = (vector<block_q4_0,_std::allocator<block_q4_0>_> *)&q41;
        if (local_14e6 != false) {
          pvVar40 = &q40;
        }
        (*(code *)local_1470[1])
                  (0x40000,&result,0,
                   (((_Vector_base<block_q4_1,_std::allocator<block_q4_1>_> *)
                    &pvVar40->super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>)->_M_impl)
                   .super__Vector_impl_data._M_start,0,puVar34,0,1);
      }
      else {
        lVar43 = 0;
        lVar44 = (long)puVar34 + 4;
        ppfVar42 = values_00;
        do {
          lVar36 = 0;
          fVar51 = 0.0;
          do {
            fVar53 = ABS(*(float *)((long)ppfVar42 + lVar36 * 4));
            if (fVar53 <= fVar51) {
              fVar53 = fVar51;
            }
            lVar36 = lVar36 + 1;
            fVar51 = fVar53;
          } while (lVar36 != 0x20);
          fVar53 = fVar53 / 127.0;
          *(float *)((long)puVar34 + lVar43 * 0x24) = fVar53;
          fVar51 = (float)(-(uint)(fVar53 != 0.0) & (uint)(1.0 / fVar53));
          lVar36 = 0;
          do {
            pfVar1 = (float *)((long)ppfVar42 + lVar36 * 4);
            fVar53 = *pfVar1;
            fVar48 = pfVar1[1];
            fVar47 = pfVar1[2];
            local_1488._0_4_ = roundf(pfVar1[3] * fVar51);
            local_1488._4_4_ = extraout_XMM0_Db;
            fVar47 = roundf(fVar47 * fVar51);
            uStack_147c = local_1488._4_4_;
            local_1488 = (double)CONCAT44((float)local_1488,fVar47);
            fVar53 = roundf(fVar53 * fVar51);
            fVar48 = roundf(fVar48 * fVar51);
            auVar50._0_4_ = (int)fVar53;
            auVar50._4_4_ = (int)fVar48;
            auVar50._8_4_ = (int)SUB84(local_1488,0);
            auVar50._12_4_ = (int)(float)((ulong)local_1488 >> 0x20);
            auVar50 = packssdw(auVar50,auVar50);
            auVar50 = packsswb(auVar50,auVar50);
            *(int *)(lVar44 + lVar36) = auVar50._0_4_;
            lVar36 = lVar36 + 4;
          } while (lVar36 != 0x20);
          lVar43 = lVar43 + 1;
          ppfVar42 = ppfVar42 + 0x10;
          lVar44 = lVar44 + 0x24;
        } while (lVar43 != 0x2000);
        puVar41 = (q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                   super__Vector_impl_data._M_start)->qs;
        result = 0.0;
        lVar43 = 0;
        lVar44 = (long)puVar34 + 4;
        do {
          iVar32 = 0;
          iVar54 = 0;
          iVar55 = 0;
          iVar56 = 0;
          lVar36 = 0;
          do {
            uVar4 = *(uint *)(puVar41 + lVar36);
            auVar60 = ZEXT415(uVar4) & DAT_00103050._0_15_;
            Var19 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar60[3]);
            auVar27._9_6_ = 0;
            auVar27._0_9_ = Var19;
            auVar20._1_10_ = SUB1510(auVar27 << 0x30,5);
            auVar20[0] = auVar60[2];
            auVar28._11_4_ = 0;
            auVar28._0_11_ = auVar20;
            auVar21._1_12_ = SUB1512(auVar28 << 0x20,3);
            auVar21[0] = auVar60[1];
            uVar59 = CONCAT11(0,auVar60[0]);
            auVar57._2_13_ = auVar21;
            auVar57._0_2_ = uVar59;
            auVar9._10_2_ = 0;
            auVar9._0_10_ = auVar57._0_10_;
            auVar9._12_2_ = (short)Var19;
            uVar31 = CONCAT42(auVar9._10_4_,auVar20._0_2_);
            auVar22._6_8_ = 0;
            auVar22._0_6_ = uVar31;
            auVar64._0_4_ = uVar59 - 8;
            auVar64._4_4_ = (int)CONCAT82(SUB148(auVar22 << 0x40,6),auVar21._0_2_) + -8;
            auVar64._8_4_ = (int)uVar31 + -8;
            auVar64._12_4_ = (auVar9._10_4_ >> 0x10) - 8;
            auVar57 = ZEXT415(CONCAT22((ushort)(uVar4 >> 0x14),(ushort)uVar4 >> 4)) &
                      DAT_00103070._0_15_;
            Var19 = CONCAT81(SUB158(ZEXT115(0) << 0x40,7),auVar57[3]);
            auVar29._9_6_ = 0;
            auVar29._0_9_ = Var19;
            auVar23._1_10_ = SUB1510(auVar29 << 0x30,5);
            auVar23[0] = auVar57[2];
            auVar30._11_4_ = 0;
            auVar30._0_11_ = auVar23;
            auVar60[2] = auVar57[1];
            auVar60._0_2_ = auVar57._0_2_;
            auVar60._3_12_ = SUB1512(auVar30 << 0x20,3);
            auVar15._2_13_ = auVar60._2_13_;
            auVar15._0_2_ = auVar57._0_2_ & 0xff;
            auVar6._10_2_ = 0;
            auVar6._0_10_ = auVar15._0_10_;
            auVar6._12_2_ = (short)Var19;
            uVar31 = CONCAT42(auVar6._10_4_,auVar23._0_2_);
            auVar24._6_8_ = 0;
            auVar24._0_6_ = uVar31;
            auVar12._4_2_ = auVar60._2_2_;
            auVar12._0_4_ = auVar15._0_4_;
            auVar12._6_8_ = SUB148(auVar24 << 0x40,6);
            auVar58._0_4_ = (auVar15._0_4_ & 0xffff) - 8;
            auVar58._4_4_ = auVar12._4_4_ + -8;
            auVar58._8_4_ = (int)uVar31 + -8;
            auVar58._12_4_ = (auVar6._10_4_ >> 0x10) - 8;
            auVar61._8_8_ = 0;
            auVar61._0_8_ = *(ulong *)(lVar44 + lVar36 * 2);
            auVar50 = psllw(auVar61,8);
            auVar50 = psraw(auVar50,8);
            auVar7._10_2_ = 0;
            auVar7._0_10_ = auVar50._0_10_;
            auVar7._12_2_ = auVar50._6_2_;
            auVar10._8_2_ = auVar50._4_2_;
            auVar10._0_8_ = auVar50._0_8_;
            auVar10._10_4_ = auVar7._10_4_;
            auVar25._6_8_ = 0;
            auVar25._0_6_ = auVar10._8_6_;
            auVar13._4_2_ = auVar50._2_2_;
            auVar13._0_4_ = auVar50._0_4_;
            auVar13._6_8_ = SUB148(auVar25 << 0x40,6);
            auVar63._0_4_ = auVar50._0_4_ & 0xffff;
            auVar63._4_10_ = auVar13._4_10_;
            auVar63._14_2_ = 0;
            auVar64 = pmaddwd(auVar63,auVar64);
            auVar50 = psraw(auVar61,8);
            auVar8._10_2_ = 0;
            auVar8._0_10_ = auVar50._0_10_;
            auVar8._12_2_ = auVar50._6_2_;
            auVar11._8_2_ = auVar50._4_2_;
            auVar11._0_8_ = auVar50._0_8_;
            auVar11._10_4_ = auVar8._10_4_;
            auVar26._6_8_ = 0;
            auVar26._0_6_ = auVar11._8_6_;
            auVar14._4_2_ = auVar50._2_2_;
            auVar14._0_4_ = auVar50._0_4_;
            auVar14._6_8_ = SUB148(auVar26 << 0x40,6);
            auVar62._0_4_ = auVar50._0_4_ & 0xffff;
            auVar62._4_10_ = auVar14._4_10_;
            auVar62._14_2_ = 0;
            auVar50 = pmaddwd(auVar62,auVar58);
            iVar32 = auVar50._0_4_ + auVar64._0_4_ + iVar32;
            iVar54 = auVar50._4_4_ + auVar64._4_4_ + iVar54;
            iVar55 = auVar50._8_4_ + auVar64._8_4_ + iVar55;
            iVar56 = auVar50._12_4_ + auVar64._12_4_ + iVar56;
            lVar36 = lVar36 + 4;
          } while (lVar36 != 0x10);
          result = result + (float)(iVar56 + iVar54 + iVar55 + iVar32) *
                            q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar43].d *
                            *(float *)((long)puVar34 + lVar43 * 0x24);
          lVar43 = lVar43 + 1;
          puVar41 = puVar41 + 0x14;
          lVar44 = lVar44 + 0x24;
        } while (lVar43 != 0x2000);
      }
      local_14d8 = local_14d8 + local_14b8;
      local_14c8 = local_14c8 + dVar49;
      local_14a0 = local_14a0 + dVar49 * dVar49;
      if (dVar49 <= local_1408) {
        dVar49 = local_1408;
      }
      local_1408 = dVar49;
      fVar51 = SUB84(local_1408,0);
      local_14d0 = local_14d0 + (double)result;
      lVar44 = std::chrono::_V2::system_clock::now();
      dVar49 = (double)(lVar44 - lVar33) * 0.001;
      local_14c0 = local_14c0 + dVar49;
      local_1498 = local_1498 + dVar49 * dVar49;
      if (dVar49 <= local_1400) {
        dVar49 = local_1400;
      }
      iVar45 = iVar45 + 1;
      local_1400 = dVar49;
    } while (iVar45 != local_14e4);
  }
  dVar5 = (double)local_14e4;
  local_1488 = dVar49;
  printf("Exact result: <dot> = %g\n",local_1490 / dVar5);
  printf("<dot> = %g, %g\n",local_14d8 / dVar5,SUB84(local_14d0 / dVar5,0));
  local_14c8 = local_14c8 / dVar5;
  dVar49 = local_14a0 / dVar5 - local_14c8 * local_14c8;
  uVar52 = SUB84(dVar49,0);
  if (0.0 < dVar49) {
    if (dVar49 < 0.0) {
      dVar49 = sqrt(dVar49);
      uVar52 = SUB84(dVar49,0);
    }
    else {
      uVar52 = SUB84(SQRT(dVar49),0);
    }
  }
  printf("time = %g +/- %g us. maxt = %g us\n",local_14c8,uVar52,SUB84(local_1408,0));
  local_14c0 = local_14c0 / dVar5;
  dVar49 = local_1498 / dVar5 - local_14c0 * local_14c0;
  uVar52 = SUB84(dVar49,0);
  if (0.0 < dVar49) {
    if (dVar49 < 0.0) {
      dVar49 = sqrt(dVar49);
      uVar52 = SUB84(dVar49,0);
    }
    else {
      uVar52 = SUB84(SQRT(dVar49),0);
    }
  }
  printf("timeq = %g +/- %g us. maxt = %g us\n",local_14c0,uVar52,SUB84(local_1488,0));
  operator_delete(puVar34,0x48000);
  if (q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)q41.super__Vector_base<block_q4_1,_std::allocator<block_q4_1>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)q40.super__Vector_base<block_q4_0,_std::allocator<block_q4_0>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  operator_delete(values_00,0x100000);
  operator_delete(values,0x100000);
  return 0;
}

Assistant:

int main(int argc, char** argv) {

    int nloop = argc > 1 ? atoi(argv[1]) : 10;
    bool scalar = argc > 2 ? atoi(argv[2]) : false;
    bool useQ4_1 = argc > 3 ? atoi(argv[3]) : false;

    if (scalar && useQ4_1) {
        printf("It is not possible to use Q4_1 quantization and scalar implementations\n");
        return 1;
    }

    std::mt19937 rndm(1234);

    std::vector<float> x1(kVecSize), y1(kVecSize);
    int n4 = useQ4_1 ? kVecSize / QK4_1 : kVecSize / QK4_0; n4 = 64*((n4 + 63)/64);
    int n8 = kVecSize / QK8_0; n8 = 64*((n8 + 63)/64);

    const auto * funcs_cpu = ggml_get_type_traits_cpu(useQ4_1 ? GGML_TYPE_Q4_1 : GGML_TYPE_Q4_0);

    std::vector<block_q4_0> q40;
    std::vector<block_q4_1> q41;
    if (useQ4_1) q41.resize(n4);
    else q40.resize(n4);
    std::vector<block_q8_0> q8(n8);
    double sumt = 0, sumt2 = 0, maxt = 0;
    double sumqt = 0, sumqt2 = 0, maxqt = 0;
    double sum = 0, sumq = 0, exactSum = 0;
    for (int iloop=0; iloop<nloop; ++iloop) {

        // Fill vector x with random numbers
        fillRandomGaussianFloats(x1, rndm);

        // Fill vector y with random numbers
        fillRandomGaussianFloats(y1, rndm);

        // Compute the exact dot product
        for (int k=0; k<kVecSize; ++k) exactSum += x1[k]*y1[k];

        // quantize x.
        // Note, we do not include this in the timing as in practical application
        // we already have the quantized model weights.
        if (useQ4_1) {
            funcs_cpu->from_float(x1.data(), q41.data(), kVecSize);
        } else {
            funcs_cpu->from_float(x1.data(), q40.data(), kVecSize);
        }

        // Now measure time the dot product needs using the "scalar" version above
        auto t1 = std::chrono::high_resolution_clock::now();
        if (useQ4_1) sum += dot41(kVecSize / QK4_1, q41.data(), y1.data());
        else sum += dot(kVecSize / QK4_0, q40.data(), y1.data());
        auto t2 = std::chrono::high_resolution_clock::now();
        auto t = 1e-3*std::chrono::duration_cast<std::chrono::nanoseconds>(t2-t1).count();
        sumt += t; sumt2 += t*t; maxt = std::max(maxt, t);

        // And now measure the time needed to quantize y and perform the dot product with the quantized y
        t1 = std::chrono::high_resolution_clock::now();
        float result;
        if (scalar) {
            quantize_row_q8_0_reference(y1.data(), q8.data(), kVecSize);
            dot_q4_q8(kVecSize, &result, q40.data(), q8.data());
        }
        else {
            const auto * vdot = ggml_get_type_traits_cpu(funcs_cpu->vec_dot_type);
            vdot->from_float(y1.data(), q8.data(), kVecSize);
            if (useQ4_1) funcs_cpu->vec_dot(kVecSize, &result, 0, q41.data(), 0, q8.data(), 0, 1);
            else funcs_cpu->vec_dot(kVecSize, &result, 0, q40.data(), 0, q8.data(), 0, 1);
        }
        sumq += result;
        t2 = std::chrono::high_resolution_clock::now();
        t = 1e-3*std::chrono::duration_cast<std::chrono::nanoseconds>(t2-t1).count();
        sumqt += t; sumqt2 += t*t; maxqt = std::max(maxqt, t);

    }

    // Report the time (and the average of the dot products so the compiler does not come up with the idea
    // of optimizing away the function calls after figuring that the result is not used).
    sum /= nloop; sumq /= nloop;
    exactSum /= nloop;
    printf("Exact result: <dot> = %g\n",exactSum);
    printf("<dot> = %g, %g\n",sum,sumq);
    sumt /= nloop; sumt2 /= nloop; sumt2 -= sumt*sumt;
    if (sumt2 > 0) sumt2 = sqrt(sumt2);
    printf("time = %g +/- %g us. maxt = %g us\n",sumt,sumt2,maxt);
    sumqt /= nloop; sumqt2 /= nloop; sumqt2 -= sumqt*sumqt;
    if (sumqt2 > 0) sumqt2 = sqrt(sumqt2);
    printf("timeq = %g +/- %g us. maxt = %g us\n",sumqt,sumqt2,maxqt);
    return 0;
}